

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# md5hl.c
# Opt level: O3

char * MD5FileChunk(char *filename,char *buf,off_t ofs,off_t len)

{
  byte bVar1;
  bool bVar2;
  int __fd;
  int iVar3;
  __off_t _Var4;
  ssize_t sVar5;
  int *piVar6;
  long lVar7;
  size_t __nbytes;
  uint len_00;
  ulong uVar8;
  ulong uVar9;
  uchar digest [16];
  MD5_CTX ctx;
  stat stbuf;
  uchar buffer [8192];
  byte local_2138 [24];
  MD5Context local_2120;
  stat local_20c8;
  uchar local_2038 [8200];
  
  MD5Init(&local_2120);
  __fd = open(filename,0);
  if ((-1 < __fd) && (iVar3 = fstat(__fd,&local_20c8), -1 < iVar3)) {
    if (local_20c8.st_size < ofs) {
      ofs = local_20c8.st_size;
    }
    _Var4 = lseek(__fd,ofs,0);
    if (-1 < _Var4) {
      uVar8 = local_20c8.st_size - ofs;
      uVar9 = len;
      if ((long)uVar8 < len) {
        uVar9 = uVar8;
      }
      if (len == 0) {
        uVar9 = uVar8;
      }
      if (0 < (long)uVar9) {
        do {
          __nbytes = 0x2000;
          if (uVar9 < 0x2000) {
            __nbytes = uVar9;
          }
          sVar5 = read(__fd,local_2038,__nbytes);
          len_00 = (uint)sVar5;
          if ((int)len_00 < 0) {
            piVar6 = __errno_location();
            iVar3 = *piVar6;
            close(__fd);
            *piVar6 = iVar3;
            return (char *)0x0;
          }
          MD5Update(&local_2120,local_2038,len_00);
          uVar8 = uVar9 - (len_00 & 0x7fffffff);
          bVar2 = (long)(ulong)(len_00 & 0x7fffffff) <= (long)uVar9;
          uVar9 = uVar8;
        } while (uVar8 != 0 && bVar2);
      }
      piVar6 = __errno_location();
      iVar3 = *piVar6;
      close(__fd);
      *piVar6 = iVar3;
      if ((buf != (char *)0x0) || (buf = (char *)malloc(0x21), buf != (char *)0x0)) {
        MD5Final(local_2138,&local_2120);
        lVar7 = 0;
        do {
          bVar1 = local_2138[lVar7];
          buf[lVar7 * 2] = "0123456789abcdef"[bVar1 >> 4];
          buf[lVar7 * 2 + 1] = "0123456789abcdef"[bVar1 & 0xf];
          lVar7 = lVar7 + 1;
        } while (lVar7 != 0x10);
        buf[0x20] = '\0';
        return buf;
      }
    }
  }
  return (char *)0x0;
}

Assistant:

char *MD5FileChunk(const char *filename, char *buf, off_t ofs, off_t len)
{
  unsigned char buffer[BUFSIZ];
  MD5_CTX ctx;
  struct stat stbuf;
  int f, i, e;
  off_t n;

  MD5Init(&ctx);
#ifdef _WIN32
  f = _open(filename, O_RDONLY | O_BINARY);
#else
  f = open(filename, O_RDONLY);
#endif
  if (f < 0)
    return 0;
  if (fstat(f, &stbuf) < 0)
    return 0;
  if (ofs > stbuf.st_size)
    ofs = stbuf.st_size;
  if ((len == 0) || (len > stbuf.st_size - ofs))
    len = stbuf.st_size - ofs;
  if (lseek(f, ofs, SEEK_SET) < 0)
    return 0;
  n = len;
  i = 0;
  while (n > 0) {
    if (n > sizeof(buffer))
      i = read(f, buffer, sizeof(buffer));
    else
      i = read(f, buffer, n);
    if (i < 0)
      break;
    MD5Update(&ctx, buffer, i);
    n -= i;
  }
  e = errno;
  close(f);
  errno = e;
  if (i < 0)
    return 0;
  return (MD5End(&ctx, buf));
}